

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
Generator_isolatedFirstOrderModel_Test::TestBody(Generator_isolatedFirstOrderModel_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  unsigned_long *in_R9;
  ValidatorPtr validator;
  AnalyserPtr analyser;
  AssertionResult gtest_ar_1;
  ComponentPtr component;
  ModelPtr model;
  string mathHeader;
  UnitsPtr mS_per_cm2;
  UnitsPtr microA_per_cm2;
  VariablePtr gamma;
  VariablePtr g_y;
  VariablePtr E_y;
  VariablePtr y;
  VariablePtr beta_y;
  VariablePtr alpha_y;
  VariablePtr V;
  UnitsPtr per_ms;
  UnitsPtr mV;
  UnitsPtr ms;
  VariablePtr i_y;
  VariablePtr t;
  string mathFooter;
  string equation2;
  string equation1;
  shared_ptr *local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  long local_210 [2];
  undefined1 local_200 [16];
  long local_1f0 [2];
  undefined1 local_1e0 [16];
  long local_1d0 [2];
  long *local_1c0;
  string *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  string *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  unsigned_long local_198;
  long *local_190 [2];
  long local_180 [2];
  string *local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  string *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  string *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  string *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  string *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  string *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  string *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  string *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  string *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  string *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  string *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  libcellml::Model::create();
  psVar1 = local_1a8;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"Tutorial4_FirstOrderModel","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  libcellml::Component::create();
  psVar1 = local_1b8;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"IonChannel","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_1a8);
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">"
             ,"");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "<apply>\n  <eq/>\n  <apply>\n    <diff/>\n    <bvar>\n      <ci>t</ci>\n    </bvar>\n    <ci>y</ci>\n  </apply>\n  <apply>\n    <minus/>\n    <apply>\n      <times/>\n      <ci>alpha_y</ci>\n      <apply>\n        <minus/>\n        <cn cellml:units=\"dimensionless\">1</cn>\n        <ci>y</ci>\n      </apply>\n    </apply>\n    <apply>\n      <times/>\n      <ci>beta_y</ci>\n      <ci>y</ci>\n    </apply>\n  </apply>\n</apply>\n"
             ,"");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "<apply>\n  <eq/>\n  <ci>i_y</ci>\n  <apply>\n    <times/>\n    <ci>g_y</ci>\n    <apply>\n      <minus/>\n      <ci>V</ci>\n      <ci>E_y</ci>\n    </apply>\n    <apply>\n      <power/>\n      <ci>y</ci>\n      <ci>gamma</ci>\n    </apply>\n  </apply>\n</apply>"
             ,"");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"</math>","");
  libcellml::Component::setMath(local_1b8);
  libcellml::Component::appendMath(local_1b8);
  libcellml::Component::appendMath(local_1b8);
  libcellml::Component::appendMath(local_1b8);
  libcellml::Variable::create();
  psVar1 = local_a0;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"t","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"millisecond","");
  libcellml::Variable::setUnits(local_a0);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::create();
  psVar1 = local_f0;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"V","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"millivolt","");
  libcellml::Variable::setUnits(local_f0);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(0.0);
  libcellml::Variable::create();
  psVar1 = local_100;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"alpha_y","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"per_millisecond","");
  libcellml::Variable::setUnits(local_100);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(1.0);
  libcellml::Variable::create();
  psVar1 = local_110;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"beta_y","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"per_millisecond","");
  libcellml::Variable::setUnits(local_110);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(2.0);
  libcellml::Variable::create();
  psVar1 = local_120;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"y","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"dimensionless","");
  libcellml::Variable::setUnits(local_120);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(1.0);
  libcellml::Variable::create();
  psVar1 = local_130;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"E_y","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"millivolt","");
  libcellml::Variable::setUnits(local_130);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(-85.0);
  libcellml::Variable::create();
  psVar1 = local_b0;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"i_y","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"microA_per_cm2","");
  libcellml::Variable::setUnits(local_b0);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::create();
  psVar1 = local_140;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"g_y","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"milliS_per_cm2","");
  libcellml::Variable::setUnits(local_140);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(36.0);
  libcellml::Variable::create();
  psVar1 = local_150;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"gamma","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"dimensionless","");
  libcellml::Variable::setUnits(local_150);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Variable::setInitialValue(4.0);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Component::addVariable((shared_ptr *)local_1b8);
  libcellml::Units::create();
  psVar1 = local_c0;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"millisecond","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"second","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"milli","");
  local_1e0._0_8_ = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  libcellml::Units::addUnit(local_c0,(string *)&local_220,1.0,1.0,(string *)local_200);
  if ((long *)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0[0] + 1);
  }
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_d0;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"millivolt","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"volt","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"milli","");
  local_1e0._0_8_ = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  libcellml::Units::addUnit(local_d0,(string *)&local_220,1.0,1.0,(string *)local_200);
  if ((long *)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0[0] + 1);
  }
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_e0;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"per_millisecond","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"millisecond","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
  libcellml::Units::addUnit(local_e0,-1.0,(string *)&local_220);
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_160;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"microA_per_cm2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  psVar1 = local_160;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"ampere","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"micro","");
  local_1e0._0_8_ = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_220,1.0,1.0,(string *)local_200);
  if ((long *)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0[0] + 1);
  }
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"metre","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"centi","");
  local_1e0._0_8_ = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  libcellml::Units::addUnit(local_160,(string *)&local_220,-2.0,1.0,(string *)local_200);
  if ((long *)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0[0] + 1);
  }
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_170;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"milliS_per_cm2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  psVar1 = local_170;
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"siemens","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"milli","");
  local_1e0._0_8_ = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_220,1.0,1.0,(string *)local_200);
  if ((long *)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0[0] + 1);
  }
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  local_220 = (shared_ptr *)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"metre","");
  local_200._0_8_ = (shared_ptr *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"centi","");
  pcVar3 = "";
  local_1e0._0_8_ = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"","");
  libcellml::Units::addUnit(local_170,(string *)&local_220,-2.0,1.0,(string *)local_200);
  if ((long *)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0[0] + 1);
  }
  if ((shared_ptr *)local_200._0_8_ != (shared_ptr *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0[0] + 1);
  }
  if (local_220 != (shared_ptr *)local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_1a8);
  libcellml::Model::addUnits((shared_ptr *)local_1a8);
  libcellml::Model::addUnits((shared_ptr *)local_1a8);
  libcellml::Model::addUnits((shared_ptr *)local_1a8);
  libcellml::Model::addUnits((shared_ptr *)local_1a8);
  libcellml::Model::linkUnits();
  libcellml::Validator::create();
  libcellml::Validator::validateModel(local_220);
  local_1e0._0_8_ = (long *)0x0;
  local_1c0 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((AssertionResult *)local_200,(internal *)"size_t(0)","validator->issueCount()",
             local_1e0,(unsigned_long *)&local_1c0,in_R9);
  if (local_200[0] == (string)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = *(char **)local_200._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/isolated/generator.cpp"
               ,0xc9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((long *)local_1e0._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_1e0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_1e0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_200 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel((shared_ptr *)local_200._0_8_);
  local_1c0 = (long *)0x0;
  local_198 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((AssertionResult *)local_1e0,(internal *)"size_t(0)","analyser->issueCount()",
             (char *)&local_1c0,&local_198,in_R9);
  if (local_1e0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((undefined8 *)local_1e0._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_1e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/isolated/generator.cpp"
               ,0xd1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if (local_1c0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_1c0 != (long *)0x0)) {
        (**(code **)(*local_1c0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1e0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
  }
  if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
  }
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
  }
  if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
  }
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  return;
}

Assistant:

TEST(Generator, isolatedFirstOrderModel)
{
    // This test resulted from https://github.com/cellml/libcellml/issues/432

    //  1.a   Create the model instance.
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("Tutorial4_FirstOrderModel");

    //  1.b   Create a component and add it into the model.
    libcellml::ComponentPtr component = libcellml::Component::create();
    component->setName("IonChannel");
    model->addComponent(component);

    //  2.a   Define the mathematics.
    const std::string mathHeader = "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">";

    // dy/dt = alpha_y*(1-y) - beta_y*y
    const std::string equation1 =
        "<apply>\n"
        "  <eq/>\n"
        "  <apply>\n"
        "    <diff/>\n"
        "    <bvar>\n"
        "      <ci>t</ci>\n"
        "    </bvar>\n"
        "    <ci>y</ci>\n"
        "  </apply>\n"
        "  <apply>\n"
        "    <minus/>\n"
        "    <apply>\n"
        "      <times/>\n"
        "      <ci>alpha_y</ci>\n"
        "      <apply>\n"
        "        <minus/>\n"
        "        <cn cellml:units=\"dimensionless\">1</cn>\n"
        "        <ci>y</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "    <apply>\n"
        "      <times/>\n"
        "      <ci>beta_y</ci>\n"
        "      <ci>y</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>\n";
    // i_y = g_y*power(y,gamma)*(V-E_y)
    const std::string equation2 =
        "<apply>\n"
        "  <eq/>\n"
        "  <ci>i_y</ci>\n"
        "  <apply>\n"
        "    <times/>\n"
        "    <ci>g_y</ci>\n"
        "    <apply>\n"
        "      <minus/>\n"
        "      <ci>V</ci>\n"
        "      <ci>E_y</ci>\n"
        "    </apply>\n"
        "    <apply>\n"
        "      <power/>\n"
        "      <ci>y</ci>\n"
        "      <ci>gamma</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>";
    const std::string mathFooter = "</math>";

    //  2.b   Add the maths to the component. Note that there is only one maths
    //        string stored, so parts which are appended must create a viable
    //        MathML string when concatenated. To clear any string, which is
    //        already stored, simply call setMath("") with an empty string.
    component->setMath(mathHeader);
    component->appendMath(equation1);
    component->appendMath(equation2);
    component->appendMath(mathFooter);

    //  3.a,b Declaring the variables, their names, units, and initial conditions
    //        Note that the names given to variables must be the same as that used
    //        within the <ci> blocks in the MathML string we created in step 2.a.

    libcellml::VariablePtr t = libcellml::Variable::create();
    t->setName("t");
    t->setUnits("millisecond");
    // Note: time is our integration base variable so it is not initialised.

    libcellml::VariablePtr V = libcellml::Variable::create();
    V->setName("V");
    V->setUnits("millivolt");
    V->setInitialValue(0.0);

    libcellml::VariablePtr alpha_y = libcellml::Variable::create();
    alpha_y->setName("alpha_y");
    alpha_y->setUnits("per_millisecond");
    alpha_y->setInitialValue(1.0);

    libcellml::VariablePtr beta_y = libcellml::Variable::create();
    beta_y->setName("beta_y");
    beta_y->setUnits("per_millisecond");
    beta_y->setInitialValue(2.0);

    libcellml::VariablePtr y = libcellml::Variable::create();
    y->setName("y");
    y->setUnits("dimensionless");
    y->setInitialValue(1.0);

    libcellml::VariablePtr E_y = libcellml::Variable::create();
    E_y->setName("E_y");
    E_y->setUnits("millivolt");
    E_y->setInitialValue(-85.0);

    libcellml::VariablePtr i_y = libcellml::Variable::create();
    i_y->setName("i_y");
    i_y->setUnits("microA_per_cm2");
    // Note that no initial value is needed for this variable as its value
    // is defined by equation2.

    libcellml::VariablePtr g_y = libcellml::Variable::create();
    g_y->setName("g_y");
    g_y->setUnits("milliS_per_cm2");
    g_y->setInitialValue(36.0);

    libcellml::VariablePtr gamma = libcellml::Variable::create();
    gamma->setName("gamma");
    gamma->setUnits("dimensionless");
    gamma->setInitialValue(4.0);

    //  3.c   Adding the variables to the component. Note that Variables are
    //        added by their pointer (cf. their name).
    component->addVariable(t);
    component->addVariable(V);
    component->addVariable(E_y);
    component->addVariable(gamma);
    component->addVariable(i_y);
    component->addVariable(g_y);
    component->addVariable(alpha_y);
    component->addVariable(beta_y);
    component->addVariable(y);

    //  4.a   Defining the units of millisecond, millivolt, per_millisecond,
    //        microA_per_cm2, and milliS_per_cm2. Note that the dimensionless
    //        units are part of those built-in already, so they don't need to be
    //        defined here.
    libcellml::UnitsPtr ms = libcellml::Units::create();
    ms->setName("millisecond");
    ms->addUnit("second", "milli");

    libcellml::UnitsPtr mV = libcellml::Units::create();
    mV->setName("millivolt");
    mV->addUnit("volt", "milli");

    libcellml::UnitsPtr per_ms = libcellml::Units::create();
    per_ms->setName("per_millisecond");
    per_ms->addUnit("millisecond", -1.0);

    libcellml::UnitsPtr microA_per_cm2 = libcellml::Units::create();
    microA_per_cm2->setName("microA_per_cm2");
    microA_per_cm2->addUnit("ampere", "micro");
    microA_per_cm2->addUnit("metre", "centi", -2.0);

    libcellml::UnitsPtr mS_per_cm2 = libcellml::Units::create();
    mS_per_cm2->setName("milliS_per_cm2");
    mS_per_cm2->addUnit("siemens", "milli");
    mS_per_cm2->addUnit("metre", "centi", -2.0);

    //  4.b   Add these units into the model.
    model->addUnits(ms);
    model->addUnits(mV);
    model->addUnits(per_ms);
    model->addUnits(microA_per_cm2);
    model->addUnits(mS_per_cm2);

    // Link the units used by variables in the model to
    // units added to the model.
    model->linkUnits();

    //  4.c   Validate the final arrangement. No issues are expected at this stage.
    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    //  5.a   Create an Analyser instance and analyse the model.

    libcellml::AnalyserPtr analyser = libcellml::Analyser::create();
    analyser->analyseModel(model);

    //  5.b   Check whether the analyser has encountered any issues.
    EXPECT_EQ(size_t(0), analyser->issueCount());
}